

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O2

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformSelect(Impl *this,Atom_t h)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  pointer pWVar5;
  pointer puVar6;
  uint32 uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint32 local_5c;
  LitSpan local_50;
  long local_40;
  pointer local_38;
  
  (this->lits_).ebo_.size = 0;
  (this->aux_).ebo_.size = 0;
  uVar1 = (this->agg_).ebo_.size;
  lVar10 = 0;
  uVar9 = 0;
  local_5c = 0;
  do {
    for (; lVar10 < this->bound_; lVar10 = lVar10 + iVar2) {
      pWVar5 = (this->agg_).ebo_.buf;
      iVar2 = pWVar5[uVar9].weight;
      local_50.first._0_4_ = pWVar5[uVar9].lit;
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back(&this->lits_,(int *)&local_50);
      local_50.first = (int *)CONCAT44(local_50.first._4_4_,(int)uVar9);
      uVar9 = (ulong)((int)uVar9 + 1);
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->aux_,(uint *)&local_50);
    }
    local_50.size = (size_t)(this->lits_).ebo_.size;
    local_50.first = (int *)local_50.size;
    if ((pointer)local_50.size != (pointer)0x0) {
      local_50.first = (this->lits_).ebo_.buf;
    }
    uVar7 = addRule(this,h,&local_50);
    local_5c = local_5c + uVar7;
    uVar3 = (this->aux_).ebo_.size;
    sVar4 = (this->lits_).ebo_.size;
    puVar6 = (this->aux_).ebo_.buf;
    pWVar5 = (this->agg_).ebo_.buf;
    local_38 = (this->sumR_).ebo_.buf;
    local_40 = (long)this->bound_;
    lVar11 = 0;
    while( true ) {
      if (-lVar11 == (ulong)uVar3) {
        return local_5c;
      }
      iVar2 = (int)lVar11;
      uVar8 = puVar6[(uVar3 - 1) + iVar2];
      (this->aux_).ebo_.size = (uVar3 - 1) + iVar2;
      (this->lits_).ebo_.size = (sVar4 - 1) + iVar2;
      lVar10 = lVar10 - pWVar5[uVar8].weight;
      uVar8 = uVar8 + 1;
      uVar9 = (ulong)uVar8;
      if ((uVar8 != uVar1) && (local_40 <= local_38[uVar8] + lVar10)) break;
      lVar11 = lVar11 + -1;
    }
  } while( true );
}

Assistant:

uint32 RuleTransform::Impl::transformSelect(Atom_t h) {
	lits_.clear();
	uint32 nRule = 0;
	wsum_t cw = 0;
	assert(sumR_[0] >= bound_ && cw < bound_);
	aux_.clear();
	for (uint32 it = 0, end = (uint32)agg_.size();;) {
		while (cw < bound_) {
			cw += Potassco::weight(agg_[it]);
			lits_.push_back(Potassco::lit(agg_[it]));
			aux_.push_back(it++);
		}
		nRule += addRule(h, Potassco::toSpan(lits_));
		do {
			if (aux_.empty()) { return nRule; }
			it = aux_.back();
			aux_.pop_back();
			lits_.pop_back();
			cw -= Potassco::weight(agg_[it]);
		} while (++it == end || (cw + sumR_[it]) < bound_);
	}
}